

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O1

void __thiscall
iDynTree::ConvexHullProjectionConstraint::buildConstraintMatrix
          (ConvexHullProjectionConstraint *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  pointer pVVar11;
  ulong uVar12;
  bool bVar13;
  
  iDynTree::MatrixDynSize::resize
            ((ulong)&this->A,
             (long)(this->projectedConvexHull).m_vertices.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->projectedConvexHull).m_vertices.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  iDynTree::VectorDynSize::resize((ulong)&this->b);
  pVVar5 = (this->projectedConvexHull).m_vertices.
           super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->projectedConvexHull).m_vertices.
                super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5;
  if (lVar9 != 0) {
    uVar10 = lVar9 >> 4;
    lVar9 = 0x10;
    uVar12 = 0;
    do {
      bVar13 = uVar12 == uVar10 - 1;
      pVVar11 = (pointer)((long)pVVar5->m_data + lVar9);
      if (bVar13) {
        pVVar11 = pVVar5;
      }
      dVar1 = *(double *)((long)pVVar5[-1].m_data + lVar9);
      lVar6 = 0;
      if (!bVar13) {
        lVar6 = lVar9;
      }
      dVar2 = *(double *)((long)pVVar5->m_data + lVar9 + -8);
      dVar3 = *(double *)((long)pVVar5->m_data + lVar6 + 8);
      dVar4 = pVVar11->m_data[0];
      lVar6 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar7 = iDynTree::MatrixDynSize::cols();
      pdVar8 = (double *)(lVar6 + lVar7 * uVar12 * 8);
      *pdVar8 = dVar3 - dVar2;
      pdVar8[1] = dVar1 - dVar4;
      pdVar8 = (double *)iDynTree::VectorDynSize::operator()(&this->b,uVar12);
      *pdVar8 = dVar1 * dVar3 - dVar2 * dVar4;
      uVar12 = uVar12 + 1;
      pVVar5 = (this->projectedConvexHull).m_vertices.
               super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(this->projectedConvexHull).m_vertices.
                     super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4;
      lVar9 = lVar9 + 0x10;
    } while (uVar12 < uVar10);
  }
  return;
}

Assistant:

void ConvexHullProjectionConstraint::buildConstraintMatrix()
    {
        // The rows of the A matrix and of the b vector depends on the number of vertices in the convex hull
        A.resize(projectedConvexHull.getNrOfVertices(),2);
        b.resize(projectedConvexHull.getNrOfVertices());

        // We assume that the vertices in projectedConvexHull are expressed in counter-clockwise order: this
        // is ensured by the structure of the Monotone Chain algorithm

        // Iterate on all line segments one by one
        for (size_t i=0; i < projectedConvexHull.getNrOfVertices(); i++)
        {
            Vector2 p0 = projectedConvexHull(i);
            Vector2 p1;

            if ( i != projectedConvexHull.getNrOfVertices()-1 )
            {
                p1 = projectedConvexHull(i+1);
            }
            else
            {
                // if we are using the last vertix, we build the line connecting it with the first vertex
                p1 = projectedConvexHull(0);
            }

            toEigen(A).block<1,2>(i,0) = Eigen::Vector2d(p1(1)-p0(1),p0(0)-p1(0));
            b(i) = p0(0)*p1(1) - p1(0)*p0(1);
        }

        return;
    }